

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O1

btWheelInfo * __thiscall
btRaycastVehicle::addWheel
          (btRaycastVehicle *this,btVector3 *connectionPointCS,btVector3 *wheelDirectionCS0,
          btVector3 *wheelAxleCS,btScalar suspensionRestLength,btScalar wheelRadius,
          btVehicleTuning *tuning,bool isFrontWheel)

{
  btScalar *pbVar1;
  btScalar bVar2;
  btScalar bVar3;
  btScalar bVar4;
  int iVar5;
  int iVar6;
  btScalar bVar7;
  btScalar bVar8;
  btScalar bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  btWheelInfo *pbVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  undefined8 *puVar21;
  undefined8 *puVar22;
  int iVar23;
  btWheelInfo *pbVar24;
  byte bVar25;
  btWheelInfo *local_148;
  
  bVar25 = 0;
  bVar7 = *(btScalar *)tuning;
  bVar8 = *(btScalar *)(tuning + 4);
  bVar9 = *(btScalar *)(tuning + 8);
  bVar2 = *(btScalar *)(tuning + 0x10);
  bVar3 = *(btScalar *)(tuning + 0xc);
  bVar4 = *(btScalar *)(tuning + 0x14);
  uVar10 = *(undefined8 *)connectionPointCS->m_floats;
  uVar11 = *(undefined8 *)(connectionPointCS->m_floats + 2);
  uVar12 = *(undefined8 *)wheelDirectionCS0->m_floats;
  uVar13 = *(undefined8 *)(wheelDirectionCS0->m_floats + 2);
  uVar14 = *(undefined8 *)wheelAxleCS->m_floats;
  uVar15 = *(undefined8 *)(wheelAxleCS->m_floats + 2);
  iVar5 = (this->m_wheelInfo).m_size;
  iVar6 = (this->m_wheelInfo).m_capacity;
  if (iVar5 == iVar6) {
    iVar23 = 1;
    if (iVar5 != 0) {
      iVar23 = iVar5 * 2;
    }
    if (iVar6 < iVar23) {
      if (iVar23 == 0) {
        local_148 = (btWheelInfo *)0x0;
      }
      else {
        local_148 = (btWheelInfo *)btAlignedAllocInternal((long)iVar23 * 0x128,0x10);
      }
      lVar18 = (long)(this->m_wheelInfo).m_size;
      if (0 < lVar18) {
        lVar20 = 0;
        do {
          pbVar24 = (this->m_wheelInfo).m_data;
          puVar21 = (undefined8 *)
                    ((long)(pbVar24->m_raycastInfo).m_contactNormalWS.m_floats + lVar20);
          puVar22 = (undefined8 *)
                    ((long)(local_148->m_raycastInfo).m_contactNormalWS.m_floats + lVar20);
          for (lVar19 = 0xc; lVar19 != 0; lVar19 = lVar19 + -1) {
            *puVar22 = *puVar21;
            puVar21 = puVar21 + (ulong)bVar25 * -2 + 1;
            puVar22 = puVar22 + (ulong)bVar25 * -2 + 1;
          }
          uVar16 = *(undefined8 *)
                    ((long)(pbVar24->m_worldTransform).m_basis.m_el[0].m_floats + lVar20 + 8);
          *(undefined8 *)((long)(local_148->m_worldTransform).m_basis.m_el[0].m_floats + lVar20) =
               *(undefined8 *)((long)(pbVar24->m_worldTransform).m_basis.m_el[0].m_floats + lVar20);
          *(undefined8 *)((long)(local_148->m_worldTransform).m_basis.m_el[0].m_floats + lVar20 + 8)
               = uVar16;
          uVar16 = *(undefined8 *)
                    ((long)(pbVar24->m_worldTransform).m_basis.m_el[1].m_floats + lVar20 + 8);
          *(undefined8 *)((long)(local_148->m_worldTransform).m_basis.m_el[1].m_floats + lVar20) =
               *(undefined8 *)((long)(pbVar24->m_worldTransform).m_basis.m_el[1].m_floats + lVar20);
          *(undefined8 *)((long)(local_148->m_worldTransform).m_basis.m_el[1].m_floats + lVar20 + 8)
               = uVar16;
          uVar16 = *(undefined8 *)
                    ((long)(pbVar24->m_worldTransform).m_basis.m_el[2].m_floats + lVar20 + 8);
          *(undefined8 *)((long)(local_148->m_worldTransform).m_basis.m_el[2].m_floats + lVar20) =
               *(undefined8 *)((long)(pbVar24->m_worldTransform).m_basis.m_el[2].m_floats + lVar20);
          *(undefined8 *)((long)(local_148->m_worldTransform).m_basis.m_el[2].m_floats + lVar20 + 8)
               = uVar16;
          uVar16 = *(undefined8 *)((long)(pbVar24->m_worldTransform).m_origin.m_floats + lVar20 + 8)
          ;
          *(undefined8 *)((long)(local_148->m_worldTransform).m_origin.m_floats + lVar20) =
               *(undefined8 *)((long)(pbVar24->m_worldTransform).m_origin.m_floats + lVar20);
          *(undefined8 *)((long)(local_148->m_worldTransform).m_origin.m_floats + lVar20 + 8) =
               uVar16;
          memcpy((void *)((long)(local_148->m_chassisConnectionPointCS).m_floats + lVar20),
                 (void *)((long)(pbVar24->m_chassisConnectionPointCS).m_floats + lVar20),0x88);
          lVar20 = lVar20 + 0x128;
        } while (lVar18 * 0x128 - lVar20 != 0);
      }
      pbVar24 = (this->m_wheelInfo).m_data;
      if (pbVar24 != (btWheelInfo *)0x0) {
        if ((this->m_wheelInfo).m_ownsMemory == true) {
          btAlignedFreeInternal(pbVar24);
        }
        (this->m_wheelInfo).m_data = (btWheelInfo *)0x0;
      }
      (this->m_wheelInfo).m_ownsMemory = true;
      (this->m_wheelInfo).m_data = local_148;
      (this->m_wheelInfo).m_capacity = iVar23;
    }
  }
  pbVar24 = (this->m_wheelInfo).m_data;
  iVar5 = (this->m_wheelInfo).m_size;
  *(undefined8 *)pbVar24[iVar5].m_wheelAxleCS.m_floats = uVar14;
  *(undefined8 *)(pbVar24[iVar5].m_wheelAxleCS.m_floats + 2) = uVar15;
  *(undefined8 *)pbVar24[iVar5].m_wheelDirectionCS.m_floats = uVar12;
  *(undefined8 *)(pbVar24[iVar5].m_wheelDirectionCS.m_floats + 2) = uVar13;
  *(undefined8 *)pbVar24[iVar5].m_chassisConnectionPointCS.m_floats = uVar10;
  *(undefined8 *)(pbVar24[iVar5].m_chassisConnectionPointCS.m_floats + 2) = uVar11;
  pbVar24[iVar5].m_suspensionRestLength1 = suspensionRestLength;
  pbVar24[iVar5].m_maxSuspensionTravelCm = bVar3;
  pbVar24[iVar5].m_wheelsRadius = wheelRadius;
  pbVar1 = &pbVar24[iVar5].m_suspensionStiffness;
  *pbVar1 = bVar7;
  pbVar1[1] = bVar8;
  pbVar1[2] = bVar9;
  pbVar1[3] = bVar2;
  pbVar17 = pbVar24 + iVar5;
  pbVar17->m_steering = 0.0;
  pbVar17->m_rotation = 0.0;
  *(undefined8 *)(&pbVar17->m_steering + 2) = 0x3dcccccd00000000;
  pbVar24[iVar5].m_maxSuspensionForce = bVar4;
  pbVar24[iVar5].m_engineForce = 0.0;
  pbVar24[iVar5].m_brake = 0.0;
  pbVar24[iVar5].m_bIsFrontWheel = isFrontWheel;
  iVar5 = (this->m_wheelInfo).m_size;
  (this->m_wheelInfo).m_size = iVar5 + 1;
  pbVar24 = (this->m_wheelInfo).m_data + iVar5;
  updateWheelTransformsWS(this,pbVar24,false);
  updateWheelTransform(this,(this->m_wheelInfo).m_size + -1,false);
  return pbVar24;
}

Assistant:

btWheelInfo&	btRaycastVehicle::addWheel( const btVector3& connectionPointCS, const btVector3& wheelDirectionCS0,const btVector3& wheelAxleCS, btScalar suspensionRestLength, btScalar wheelRadius,const btVehicleTuning& tuning, bool isFrontWheel)
{

	btWheelInfoConstructionInfo ci;

	ci.m_chassisConnectionCS = connectionPointCS;
	ci.m_wheelDirectionCS = wheelDirectionCS0;
	ci.m_wheelAxleCS = wheelAxleCS;
	ci.m_suspensionRestLength = suspensionRestLength;
	ci.m_wheelRadius = wheelRadius;
	ci.m_suspensionStiffness = tuning.m_suspensionStiffness;
	ci.m_wheelsDampingCompression = tuning.m_suspensionCompression;
	ci.m_wheelsDampingRelaxation = tuning.m_suspensionDamping;
	ci.m_frictionSlip = tuning.m_frictionSlip;
	ci.m_bIsFrontWheel = isFrontWheel;
	ci.m_maxSuspensionTravelCm = tuning.m_maxSuspensionTravelCm;
	ci.m_maxSuspensionForce = tuning.m_maxSuspensionForce;

	m_wheelInfo.push_back( btWheelInfo(ci));
	
	btWheelInfo& wheel = m_wheelInfo[getNumWheels()-1];
	
	updateWheelTransformsWS( wheel , false );
	updateWheelTransform(getNumWheels()-1,false);
	return wheel;
}